

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix3 * matrix3_invert(matrix3 *self)

{
  matrix3 *pmVar1;
  long lVar2;
  matrix3 inverse;
  matrix3 local_2c;
  
  pmVar1 = matrix3_inverse(self,&local_2c);
  if (pmVar1 != (matrix3 *)0x0) {
    for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
      (self->field_0).m[lVar2] = local_2c.field_0.m[lVar2];
    }
  }
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_invert(struct matrix3 *self)
{
	struct matrix3 inverse;
	uint8_t i;

	if (matrix3_inverse(self, &inverse)) {
		for (i = 0; i < 9; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}